

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

DrawResult * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::draw
          (DrawResult *__return_storage_ptr__,BaseTestInstance *this,deUint32 vertexCount,
          vector<float,_std::allocator<float>_> *patchTessLevels,Winding winding,bool usePointMode)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  Allocation *pAVar2;
  int *memory;
  TestLog *pTVar3;
  int iVar4;
  int iVar5;
  DeviceInterface *vk;
  VkDevice device;
  GraphicsPipelineBuilder *pGVar6;
  const_iterator cVar7;
  ostream *poVar8;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  _func_bool_PerPrimitive_ptr_PerPrimitive_ptr *pred;
  long lVar9;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *unsorted;
  char *pcVar10;
  int iVar11;
  int numIndentationSpaces;
  key_type local_3c0;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  string local_380;
  key_type local_360;
  VkQueue local_340;
  Move<vk::Handle<(vk::HandleType)18>_> local_338;
  VkPipeline local_318;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_310;
  key_type local_2f8;
  string local_2d8;
  undefined1 local_2b8 [252];
  deUint32 local_1bc;
  bool local_1b8;
  VkPrimitiveTopology local_1b4;
  VkDeviceSize vertexBufferOffset;
  pointer local_1a8;
  pointer local_1a0;
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_340 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  memset((GraphicsPipelineBuilder *)local_2b8,0,0xfc);
  local_1b8 = false;
  local_1b4 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_1bc = 6;
  pGVar6 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                     ((GraphicsPipelineBuilder *)local_2b8,this->m_vertexFormat,this->m_vertexStride
                     );
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"vert","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_3c0);
  pGVar6 = GraphicsPipelineBuilder::setShader
                     (pGVar6,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"tesc","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_360);
  pGVar6 = GraphicsPipelineBuilder::setShader
                     (pGVar6,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"tese","");
  getProgramName(&local_2d8,&local_380,winding,usePointMode);
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_2d8);
  pGVar6 = GraphicsPipelineBuilder::setShader
                     (pGVar6,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"geom","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertexBufferOffset);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&vertexBufferOffset,(char *)local_3a0,local_398);
  pcVar10 = "";
  if (usePointMode) {
    pcVar10 = "_point_mode";
  }
  lVar9 = 0xb;
  if (!usePointMode) {
    lVar9 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar10,lVar9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertexBufferOffset);
  std::ios_base::~ios_base(local_140);
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_2f8);
  pGVar6 = GraphicsPipelineBuilder::setShader
                     (pGVar6,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            (&local_338,pGVar6,vk,device,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal);
  DStack_310.m_device =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  DStack_310.m_allocator =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_318.m_internal =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  DStack_310.m_deviceIface =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_2b8);
  pAVar2 = (this->m_resultBuffer).m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar2->m_hostPtr,0,this->m_resultBufferSizeBytes);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             this->m_resultBufferSizeBytes);
  beginCommandBuffer(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  beginRenderPassWithRasterizationDisabled
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkFramebuffer)
             (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             local_318.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,0,1,&this->m_descriptorSet,0,0);
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)vertexCount,1,0,0);
  endRenderPass(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&vertexBufferOffset,0x40,0x2000,
             (VkBuffer)
             (this->m_resultBuffer).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
             object.m_internal,0,this->m_resultBufferSizeBytes);
  numIndentationSpaces = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x8000,
             0x4000,0,0,0,1,(VkBufferMemoryBarrier *)&vertexBufferOffset,0,0);
  endCommandBuffer(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitCommandsAndWait
            (vk,device,local_340,
             (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pAVar2 = (this->m_resultBuffer).m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             this->m_resultBufferSizeBytes);
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->success = true;
  iVar11 = this->m_numPatchesToDraw;
  iVar4 = multiplePatchReferencePrimitiveCount
                    ((this->m_caseDef).primitiveType,(this->m_caseDef).spacingMode,usePointMode,
                     (patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start,iVar11);
  __return_storage_ptr__->refNumPrimitives = iVar4;
  iVar5 = numVerticesPerPrimitive((this->m_caseDef).primitiveType,usePointMode);
  __return_storage_ptr__->numPrimitiveVertices = iVar5;
  memory = (int *)pAVar2->m_hostPtr;
  iVar5 = *memory;
  __return_storage_ptr__->numPrimitives = iVar5;
  pred = (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)
         (ulong)(uint)this->m_resultBufferPrimitiveDataOffset;
  readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
            ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)local_2b8,iVar5,memory,this->m_resultBufferPrimitiveDataOffset,iVar11);
  sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
            ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)&vertexBufferOffset,(tessellation *)local_2b8,unsorted,pred);
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)vertexBufferOffset;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_1a8;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a0;
  if ((int  [2])local_2b8._0_8_ != (int  [2])0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
    local_1a8 = extraout_RAX;
  }
  if (iVar5 != iVar4) {
    pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    iVar11 = this->m_numPatchesToDraw;
    vertexBufferOffset = (VkDeviceSize)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Failure: the number of generated primitives is ",0x2f);
    std::ostream::operator<<((ostringstream *)&local_1a8,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected at least ",0x14);
    std::ostream::operator<<((ostringstream *)&local_1a8,iVar4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (iVar11 == 1) {
      vertexBufferOffset = (VkDeviceSize)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "Note: rendered one patch; tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                 ,0x6f);
      local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           (deUint64)
           (patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_3c0._M_dataplus._M_p =
           (pointer)(patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
      elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                ((string *)local_2b8,(tessellation *)&local_338,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 &local_3c0,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 0x6,0,numIndentationSpaces);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(char *)local_2b8._0_8_,local_2b8._8_8_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
    }
    else {
      vertexBufferOffset = (VkDeviceSize)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Note: rendered ",0xf);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," patches in one draw call; ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                 ,100);
      local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           (deUint64)
           (patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_3c0._M_dataplus._M_p =
           (pointer)(patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
      elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                ((string *)local_2b8,(tessellation *)&local_338,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 &local_3c0,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 0x6,0,numIndentationSpaces);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(char *)local_2b8._0_8_,local_2b8._8_8_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    local_1a8 = (pointer)std::ios_base::~ios_base(local_138);
    __return_storage_ptr__->success = false;
  }
  if (local_318.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_310,local_318);
    local_1a8 = extraout_RAX_00;
  }
  return (DrawResult *)local_1a8;
}

Assistant:

BaseTestInstance::DrawResult BaseTestInstance::draw (const deUint32 vertexCount, const std::vector<float>& patchTessLevels, const Winding winding, const bool usePointMode)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();
	const VkQueue			queue	= m_context.getUniversalQueue();

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(m_vertexFormat, m_vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", winding, usePointMode)), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", usePointMode)), DE_NULL)
		.build                        (vk, device, *m_pipelineLayout, *m_renderPass));

	{
		const Allocation& alloc = m_resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(m_resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_resultBufferSizeBytes);
	}

	beginCommandBuffer(vk, *m_cmdBuffer);
	beginRenderPassWithRasterizationDisabled(vk, *m_cmdBuffer, *m_renderPass, *m_framebuffer);

	vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*m_cmdBuffer, vertexCount, 1u, 0u, 0u);
	endRenderPass(vk, *m_cmdBuffer);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *m_resultBuffer, 0ull, m_resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *m_cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read back and check results

	const Allocation& resultAlloc = m_resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_resultBufferSizeBytes);

	DrawResult result;
	result.success				= true;
	result.refNumPrimitives     = multiplePatchReferencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, usePointMode, &patchTessLevels[0], m_numPatchesToDraw);
	result.numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, usePointMode);
	result.numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
	result.primitives           = sorted(readInterleavedData<PerPrimitive>(result.numPrimitives, resultAlloc.getHostPtr(), m_resultBufferPrimitiveDataOffset, sizeof(PerPrimitive)),
										 byPatchPrimitiveID);

	// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
	DE_ASSERT(result.numPrimitives <= m_maxNumPrimitivesInDrawCall);

	tcu::TestLog& log = m_context.getTestContext().getLog();
	if (result.numPrimitives != result.refNumPrimitives)
	{
		logPrimitiveCountError(log, m_numPatchesToDraw, result.numPrimitives, result.refNumPrimitives, patchTessLevels);
		result.success = false;
	}
	return result;
}